

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_query.c
# Opt level: O0

void build_alloc_qu_error(Dwarf_Debug dbg,char *fieldname,Dwarf_Error *error)

{
  undefined8 error_00;
  char *msg;
  undefined1 local_40 [8];
  dwarfstring m;
  Dwarf_Error *error_local;
  char *fieldname_local;
  Dwarf_Debug dbg_local;
  
  m._24_8_ = error;
  dwarfstring_constructor((dwarfstring_s *)local_40);
  dwarfstring_append_printf_s
            ((dwarfstring *)local_40,"DW_DLE_ALLOC_FAIL : Attempt to malloc space for %s failed",
             fieldname);
  error_00 = m._24_8_;
  msg = dwarfstring_string((dwarfstring_s *)local_40);
  _dwarf_error_string(dbg,(Dwarf_Error *)error_00,0x3e,msg);
  dwarfstring_destructor((dwarfstring_s *)local_40);
  return;
}

Assistant:

static void
build_alloc_qu_error(Dwarf_Debug dbg,
    const char *fieldname,
    Dwarf_Error *error)
{
    dwarfstring m;

    dwarfstring_constructor(&m);
    dwarfstring_append_printf_s(&m,
        "DW_DLE_ALLOC_FAIL :"
        " Attempt to malloc space for %s failed",
        (char *)fieldname);
    _dwarf_error_string(dbg,error,DW_DLE_ALLOC_FAIL,
        dwarfstring_string(&m));
    dwarfstring_destructor(&m);
}